

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O1

bool IsFileInDir(string *infile,string *indir)

{
  int iVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string dir;
  string file;
  string local_58;
  string local_38;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  cmsys::SystemTools::CollapseFullPath(&local_38,infile);
  cmsys::SystemTools::CollapseFullPath(&local_58,indir);
  if (local_58._M_string_length < local_38._M_string_length) {
    local_18._M_len = local_38._M_string_length;
    local_18._M_str = local_38._M_dataplus._M_p;
    __str._M_str = local_58._M_dataplus._M_p;
    __str._M_len = local_58._M_string_length;
    iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (&local_18,0,local_58._M_string_length,__str);
    if (iVar1 == 0) {
      bVar2 = local_38._M_dataplus._M_p[local_58._M_string_length] == '/';
      goto LAB_001981a7;
    }
  }
  bVar2 = false;
LAB_001981a7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

static bool IsFileInDir(const std::string& infile, const std::string& indir)
{
  std::string file = cmSystemTools::CollapseFullPath(infile);
  std::string dir = cmSystemTools::CollapseFullPath(indir);

  return file.size() > dir.size() && fnc_prefix(file, dir) &&
    file[dir.size()] == '/';
}